

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_AddModuleExport(JSContext *ctx,JSModuleDef *m,char *export_name)

{
  JSAtom JVar1;
  JSExportEntry *pJVar2;
  JSContext *in_RDX;
  JSAtom name;
  JSExportEntry *me;
  JSAtom in_stack_00000030;
  JSAtom in_stack_00000034;
  JSModuleDef *in_stack_00000038;
  JSParseState *in_stack_00000040;
  JSContext *in_stack_00000048;
  JSAtom in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  JVar1 = JS_NewAtom(in_RDX,in_stack_ffffffffffffffd8);
  if (JVar1 == 0) {
    local_4 = -1;
  }
  else {
    pJVar2 = add_export_entry2(in_stack_00000048,in_stack_00000040,in_stack_00000038,
                               in_stack_00000034,in_stack_00000030,ctx._4_4_);
    JS_FreeAtom((JSContext *)CONCAT44(JVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
    if (pJVar2 == (JSExportEntry *)0x0) {
      local_4 = -1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int JS_AddModuleExport(JSContext *ctx, JSModuleDef *m, const char *export_name)
{
    JSExportEntry *me;
    JSAtom name;
    name = JS_NewAtom(ctx, export_name);
    if (name == JS_ATOM_NULL)
        return -1;
    me = add_export_entry2(ctx, NULL, m, JS_ATOM_NULL, name,
                           JS_EXPORT_TYPE_LOCAL);
    JS_FreeAtom(ctx, name);
    if (!me)
        return -1;
    else
        return 0;
}